

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall clipp::detail::scoped_dfs_traverser::check_if_left_scope(scoped_dfs_traverser *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  scoped_dfs_traverser *this_local;
  
  bVar1 = group::depth_first_traverser::operator_cast_to_bool(&this->posAfterLastMatch_);
  if (bVar1) {
    iVar3 = group::depth_first_traverser::level(&this->pos_);
    iVar4 = group::depth_first_traverser::level(&this->posAfterLastMatch_);
    if (iVar3 < iVar4) {
      while( true ) {
        bVar2 = std::
                stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                ::empty(&this->scopes_);
        bVar1 = false;
        if (!bVar2) {
          pvVar5 = std::
                   stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                   ::top(&this->scopes_);
          iVar3 = group::depth_first_traverser::memento::level(pvVar5);
          iVar4 = group::depth_first_traverser::level(&this->pos_);
          bVar1 = iVar4 <= iVar3;
        }
        if (!bVar1) break;
        pvVar5 = std::
                 stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                 ::top(&this->scopes_);
        group::depth_first_traverser::undo(&this->pos_,pvVar5);
        std::
        stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
        ::pop(&this->scopes_);
      }
      group::depth_first_traverser::invalidate(&this->posAfterLastMatch_);
    }
  }
  while( true ) {
    bVar2 = std::
            stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
            ::empty(&this->scopes_);
    bVar1 = false;
    if (!bVar2) {
      pvVar5 = std::
               stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
               ::top(&this->scopes_);
      iVar3 = group::depth_first_traverser::memento::level(pvVar5);
      iVar4 = group::depth_first_traverser::level(&this->pos_);
      bVar1 = iVar4 < iVar3;
    }
    if (!bVar1) break;
    pvVar5 = std::
             stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
             ::top(&this->scopes_);
    group::depth_first_traverser::undo(&this->pos_,pvVar5);
    std::
    stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
    ::pop(&this->scopes_);
  }
  bVar1 = repeat_group_continues(this);
  this->repeatGroupContinues_ = bVar1;
  return;
}

Assistant:

void check_if_left_scope()
    {
        if(posAfterLastMatch_) {
            if(pos_.level() < posAfterLastMatch_.level()) {
                while(!scopes_.empty() && scopes_.top().level() >= pos_.level()) {
                    pos_.undo(scopes_.top());
                    scopes_.pop();
                }
                posAfterLastMatch_.invalidate();
            }
        }
        while(!scopes_.empty() && scopes_.top().level() > pos_.level()) {
            pos_.undo(scopes_.top());
            scopes_.pop();
        }
        repeatGroupContinues_ = repeat_group_continues();
    }